

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_iceball(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int dam_00;
  char *pcVar3;
  CHAR_DATA *in_RDX;
  int dam;
  char buf [4608];
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  undefined4 in_stack_ffffffffffffed98;
  int in_stack_ffffffffffffed9c;
  CHAR_DATA *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  CHAR_DATA *in_stack_ffffffffffffedb0;
  char *in_stack_ffffffffffffedb8;
  uint in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedd0;
  int in_stack_ffffffffffffedd4;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  int in_stack_ffffffffffffede0;
  CHAR_DATA *local_28;
  
  dam_00 = dice((int)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed9c);
  pCVar1 = in_RDX->in_room->people;
  while (local_28 = pCVar1, local_28 != (CHAR_DATA *)0x0) {
    pCVar1 = local_28->next_in_room;
    bVar2 = is_same_group(local_28,in_RDX);
    if ((!bVar2) &&
       (((in_RDX->cabal < 1 || (in_RDX->cabal != local_28->cabal)) &&
        (bVar2 = is_safe(in_stack_ffffffffffffeda0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98))
        , !bVar2)))) {
      bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
      if (((!bVar2) &&
          (bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98)
                         ), !bVar2)) &&
         ((in_RDX->fighting == (CHAR_DATA *)0x0 || (local_28->fighting == (CHAR_DATA *)0x0)))) {
        in_stack_ffffffffffffedc0 =
             number_range((int)in_stack_ffffffffffffeda0,in_stack_ffffffffffffed9c);
        if (in_stack_ffffffffffffedc0 < 2) {
          in_stack_ffffffffffffedb8 = &stack0xffffffffffffedc8;
          pcVar3 = pers(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
          sprintf(in_stack_ffffffffffffedb8,"Die, %s you sorcerous dog!",pcVar3);
        }
        else if (in_stack_ffffffffffffedc0 == 2) {
          in_stack_ffffffffffffedb0 = (CHAR_DATA *)&stack0xffffffffffffedc8;
          pcVar3 = pers(in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0);
          sprintf((char *)in_stack_ffffffffffffedb0,"Help! %s is casting a spell on me!",pcVar3);
        }
        if (local_28 != in_RDX) {
          do_myell(in_stack_ffffffffffffedb0,(char *)in_stack_ffffffffffffeda8,
                   in_stack_ffffffffffffeda0);
        }
      }
      in_stack_ffffffffffffeda0 = in_RDX;
      bVar2 = saves_spell(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                          in_stack_ffffffffffffedd4);
      in_stack_ffffffffffffed9c = dam_00;
      if (bVar2) {
        in_stack_ffffffffffffed9c = dam_00 / 2;
      }
      damage_old((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                 in_stack_ffffffffffffedc8,dam_00,in_stack_ffffffffffffedc0,
                 (int)((ulong)in_stack_ffffffffffffedb8 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffedb8 >> 0x18,0));
      in_stack_ffffffffffffeda8 = local_28;
    }
  }
  return;
}

Assistant:

void spell_iceball(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch;
	CHAR_DATA *vch_next;
	char buf[MAX_STRING_LENGTH];

	int dam = dice(level, 6);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_same_group(vch, ch))
			continue;

		if (ch->cabal > 0 && ch->cabal == vch->cabal)
			continue;

		if (is_safe(ch, vch))
			continue;

		if (!is_npc(ch) && !is_npc(vch) && (ch->fighting == nullptr || vch->fighting == nullptr))
		{
			switch (number_range(0, 2))
			{
				case 0:
				case 1:
					sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, vch));
					break;
				case 2:
					sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, vch));
			}

			if (vch != ch)
				do_myell(vch, buf, ch);
		}

		damage_old(ch, vch, (saves_spell(level, vch, DAM_COLD) ? dam / 2 : dam), sn, DAM_COLD, true);
	}
}